

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint-test.cc
# Opt level: O2

void __thiscall SafeIntTest_MulOverflow_Test::TestBody(SafeIntTest_MulOverflow_Test *this)

{
  bool bVar1;
  AssertHelper AStack_18;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::operator*((SafeInt<int>)0x80000000,(SafeInt<int>)0xffffffff);
  }
  testing::Message::Message((Message *)&local_10);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_18,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/safeint-test.cc",0x5a
             ,
             "Expected: SafeInt<int>((-2147483647 -1)) * -1 throws an exception of type OverflowError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_18,(Message *)&local_10);
  testing::internal::AssertHelper::~AssertHelper(&AStack_18);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_10);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::operator*((SafeInt<int>)0x3fffffff,(SafeInt<int>)0x3);
  }
  testing::Message::Message((Message *)&local_10);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_18,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/safeint-test.cc",0x5b
             ,
             "Expected: SafeInt<int>(2147483647 / 2) * 3 throws an exception of type OverflowError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_18,(Message *)&local_10);
  testing::internal::AssertHelper::~AssertHelper(&AStack_18);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_10);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::operator*((SafeInt<int>)0x65,(SafeInt<int>)0x147ae14);
  }
  testing::Message::Message((Message *)&local_10);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_18,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/safeint-test.cc",0x5c
             ,
             "Expected: SafeInt<int>(101) * (2147483647 / 100) throws an exception of type OverflowError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_18,(Message *)&local_10);
  testing::internal::AssertHelper::~AssertHelper(&AStack_18);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_10);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::operator*((SafeInt<int>)0xffffff9b,(SafeInt<int>)0x147ae14);
  }
  testing::Message::Message((Message *)&local_10);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_18,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/safeint-test.cc",0x5d
             ,
             "Expected: SafeInt<int>(-101) * (2147483647 / 100) throws an exception of type OverflowError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_18,(Message *)&local_10);
  testing::internal::AssertHelper::~AssertHelper(&AStack_18);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_10);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::operator*((SafeInt<int>)0x65,(SafeInt<int>)0xfeb851ec);
  }
  testing::Message::Message((Message *)&local_10);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_18,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/safeint-test.cc",0x5e
             ,
             "Expected: SafeInt<int>(101) * -(2147483647 / 100) throws an exception of type OverflowError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_18,(Message *)&local_10);
  testing::internal::AssertHelper::~AssertHelper(&AStack_18);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_10);
  return;
}

Assistant:

TEST(SafeIntTest, MulOverflow) {
  EXPECT_THROW(SafeInt<int>(INT_MIN) * -1, OverflowError);
  EXPECT_THROW(SafeInt<int>(INT_MAX / 2) * 3, OverflowError);
  EXPECT_THROW(SafeInt<int>(101) * (INT_MAX / 100), OverflowError);
  EXPECT_THROW(SafeInt<int>(-101) * (INT_MAX / 100), OverflowError);
  EXPECT_THROW(SafeInt<int>(101) * -(INT_MAX / 100), OverflowError);
}